

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

SentencePieceTrainer * __thiscall
sentencepiece::SentencePieceTrainer::PopulateNormalizerSpec
          (SentencePieceTrainer *this,NormalizerSpec *normalizer_spec,bool is_denormalizer)

{
  ostringstream *poVar1;
  char *pcVar2;
  undefined8 *puVar3;
  string *psVar4;
  ulong uVar5;
  string_view name;
  string_view filename;
  CharsMap chars_map;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  size_t local_178;
  ios_base local_128 [264];
  
  if (normalizer_spec == (NormalizerSpec *)0x0) {
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"src/sentencepiece_trainer.cc",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::operator<<((ostream *)poVar1,0xee);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"normalizer_spec",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  else {
    puVar3 = (undefined8 *)(*(ulong *)(normalizer_spec + 0x40) & 0xfffffffffffffffe);
    if (puVar3[1] == 0) {
      if (!is_denormalizer) {
        if (*(long *)((*(ulong *)(normalizer_spec + 0x30) & 0xfffffffffffffffe) + 8) == 0) {
          normalizer_spec[0x28] = (NormalizerSpec)((byte)normalizer_spec[0x28] | 1);
          local_1a0 = (undefined1  [8])(local_1a0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a0,(anonymous_namespace)::kDefaultNormalizerName,0x26c130);
          uVar5 = *(ulong *)(normalizer_spec + 8);
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set(normalizer_spec + 0x30,local_1a0,uVar5);
          if (local_1a0 != (undefined1  [8])(local_1a0 + 0x10)) {
            operator_delete((void *)local_1a0,(ulong)((long)&(local_198._M_parent)->_M_color + 1));
          }
        }
        if (*(long *)((*(ulong *)(normalizer_spec + 0x38) & 0xfffffffffffffffe) + 8) == 0) {
          uVar5 = *(ulong *)(normalizer_spec + 8);
          psVar4 = *(string **)(*(ulong *)(normalizer_spec + 0x30) & 0xfffffffffffffffe);
          pcVar2 = (char *)((undefined8 *)(*(ulong *)(normalizer_spec + 0x30) & 0xfffffffffffffffe))
                           [1];
          *(uint *)(normalizer_spec + 0x28) = *(uint *)(normalizer_spec + 0x28) | 2;
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                    (normalizer_spec + 0x38,uVar5);
          name._M_str = pcVar2;
          name._M_len = (size_t)this;
          normalizer::Builder::GetPrecompiledCharsMap(name,psVar4);
          if (*(long *)this != 0) {
            return this;
          }
          sentencepiece::util::Status::~Status((Status *)this);
        }
      }
LAB_001755a9:
      sentencepiece::util::Status::Status((Status *)this);
      return this;
    }
    if (*(long *)((*(ulong *)(normalizer_spec + 0x38) & 0xfffffffffffffffe) + 8) == 0) {
      local_198._M_left = (_Base_ptr)(local_1a0 + 8);
      local_198._M_color = _S_red;
      local_198._M_parent = (_Base_ptr)0x0;
      local_178 = 0;
      filename._M_str = (char *)puVar3[1];
      filename._M_len = (size_t)this;
      local_198._M_right = local_198._M_left;
      normalizer::Builder::LoadCharsMap(filename,(CharsMap *)*puVar3);
      if (*(long *)this == 0) {
        sentencepiece::util::Status::~Status((Status *)this);
        normalizer_spec[0x28] = (NormalizerSpec)((byte)normalizer_spec[0x28] | 2);
        uVar5 = *(ulong *)(normalizer_spec + 8);
        if ((uVar5 & 1) != 0) {
          uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
        }
        psVar4 = (string *)
                 google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                           (normalizer_spec + 0x38,uVar5);
        normalizer::Builder::CompileCharsMap((Builder *)this,(CharsMap *)local_1a0,psVar4);
        if (*(long *)this == 0) {
          sentencepiece::util::Status::~Status((Status *)this);
          normalizer_spec[0x28] = (NormalizerSpec)((byte)normalizer_spec[0x28] | 1);
          local_1c0[0] = local_1b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"user_defined","");
          uVar5 = *(ulong *)(normalizer_spec + 8);
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set(normalizer_spec + 0x30,local_1c0,uVar5);
          if (local_1c0[0] != local_1b0) {
            operator_delete(local_1c0[0],local_1b0[0] + 1);
          }
          std::
          _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       *)local_1a0);
          goto LAB_001755a9;
        }
      }
      std::
      _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   *)local_1a0);
      return this;
    }
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"src/sentencepiece_trainer.cc",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::operator<<((ostream *)poVar1,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"normalizer_spec->precompiled_charsmap().empty()",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"precompiled_charsmap is already defined.",0x28);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  std::ios_base::~ios_base(local_128);
  return this;
}

Assistant:

util::Status SentencePieceTrainer::PopulateNormalizerSpec(
    NormalizerSpec *normalizer_spec, bool is_denormalizer) {
  CHECK_OR_RETURN(normalizer_spec);

  if (!normalizer_spec->normalization_rule_tsv().empty()) {
    CHECK_OR_RETURN(normalizer_spec->precompiled_charsmap().empty())
        << "precompiled_charsmap is already defined.";
    normalizer::Builder::CharsMap chars_map;
    RETURN_IF_ERROR(normalizer::Builder::LoadCharsMap(
        normalizer_spec->normalization_rule_tsv(), &chars_map));
    RETURN_IF_ERROR(normalizer::Builder::CompileCharsMap(
        chars_map, normalizer_spec->mutable_precompiled_charsmap()));
    normalizer_spec->set_name("user_defined");
  } else if (!is_denormalizer) {
    if (normalizer_spec->name().empty()) {
      normalizer_spec->set_name(kDefaultNormalizerName);
    }
    if (normalizer_spec->precompiled_charsmap().empty()) {
      RETURN_IF_ERROR(normalizer::Builder::GetPrecompiledCharsMap(
          normalizer_spec->name(),
          normalizer_spec->mutable_precompiled_charsmap()));
    }
  }

  return util::OkStatus();
}